

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_base.cpp
# Opt level: O3

out_pipe_t * __thiscall
zmq::routing_socket_base_t::lookup_out_pipe(routing_socket_base_t *this,blob_t *routing_id_)

{
  const_iterator cVar1;
  out_pipe_t *poVar2;
  
  cVar1 = std::
          _Rb_tree<zmq::blob_t,_std::pair<const_zmq::blob_t,_zmq::routing_socket_base_t::out_pipe_t>,_std::_Select1st<std::pair<const_zmq::blob_t,_zmq::routing_socket_base_t::out_pipe_t>_>,_std::less<zmq::blob_t>,_std::allocator<std::pair<const_zmq::blob_t,_zmq::routing_socket_base_t::out_pipe_t>_>_>
          ::find(&(this->_out_pipes)._M_t,routing_id_);
  poVar2 = (out_pipe_t *)0x0;
  if ((_Rb_tree_header *)cVar1._M_node != &(this->_out_pipes)._M_t._M_impl.super__Rb_tree_header) {
    poVar2 = (out_pipe_t *)&cVar1._M_node[1]._M_right;
  }
  return poVar2;
}

Assistant:

const zmq::routing_socket_base_t::out_pipe_t *
zmq::routing_socket_base_t::lookup_out_pipe (const blob_t &routing_id_) const
{
    // TODO we could probably avoid constructor a temporary blob_t to call this function
    const out_pipes_t::const_iterator it = _out_pipes.find (routing_id_);
    return it == _out_pipes.end () ? NULL : &it->second;
}